

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,NodeRef *args,uint *args_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer pEVar4;
  size_type sVar5;
  ulong uVar6;
  undefined8 uVar7;
  pointer pEVar8;
  pointer pEVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  pointer pEVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  pointer __src;
  long lVar16;
  
  pEVar4 = this->data_;
  sVar5 = this->len;
  __src = pEVar4 + sVar5;
  if (sVar5 != this->cap) {
    uVar6 = (args->pip).value;
    uVar3 = *args_1;
    __src->node = (void *)(uVar6 & 0xffffffffffffffc0);
    __src->size = ((uint)uVar6 & 0x3f) + 1;
    __src->offset = uVar3;
    this->len = sVar5 + 1;
    return pEVar4 + sVar5;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar15 = this->len + 1;
  uVar6 = this->cap;
  if (uVar15 < uVar6 * 2) {
    uVar15 = uVar6 * 2;
  }
  if (0x7ffffffffffffff - uVar6 < uVar6) {
    uVar15 = 0x7ffffffffffffff;
  }
  lVar16 = (long)__src - (long)this->data_;
  pEVar12 = (pointer)operator_new(uVar15 << 4);
  uVar6 = (args->pip).value;
  uVar3 = *args_1;
  *(ulong *)((long)pEVar12 + lVar16) = uVar6 & 0xffffffffffffffc0;
  *(uint *)((long)pEVar12 + lVar16 + 8) = ((uint)uVar6 & 0x3f) + 1;
  *(uint *)((long)pEVar12 + lVar16 + 0xc) = uVar3;
  pEVar4 = this->data_;
  lVar13 = this->len * 0x10;
  lVar14 = (long)pEVar4 + (lVar13 - (long)__src);
  pEVar8 = pEVar4;
  pEVar9 = pEVar12;
  if (lVar14 == 0) {
    if (this->len != 0) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pEVar4->node + lVar14);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar12->node + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        lVar14 = lVar14 + 0x10;
      } while (lVar13 != lVar14);
    }
  }
  else {
    for (; pEVar8 != __src; pEVar8 = pEVar8 + 1) {
      uVar10 = pEVar8->size;
      uVar11 = pEVar8->offset;
      pEVar9->node = pEVar8->node;
      pEVar9->size = uVar10;
      pEVar9->offset = uVar11;
      pEVar9 = pEVar9 + 1;
    }
    memcpy((void *)((long)pEVar12 + lVar16 + 0x10),__src,
           (lVar14 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (pEVar4 != (pointer)this->firstElement) {
    operator_delete(pEVar4);
  }
  this->len = this->len + 1;
  this->cap = uVar15;
  this->data_ = pEVar12;
  return (reference)((long)pEVar12 + lVar16);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }